

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding-hash.cc
# Opt level: O1

void __thiscall
wabt::BindingHash::CallCallbacks
          (BindingHash *this,ValueTypeVector *duplicates,DuplicateCallback *callback)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  **pppVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  **pppVar2;
  bool bVar3;
  __normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
  __it;
  __normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
  _Var4;
  long lVar5;
  _Any_data *p_Var6;
  __normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
  __it_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  **pppVar7;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  **local_48;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  **local_40;
  _Any_data *local_38;
  
  local_48 = (duplicates->
             super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  pppVar1 = (duplicates->
            super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_38 = (_Any_data *)callback;
  do {
    if (local_48 == pppVar1) {
      return;
    }
    __it._M_current =
         (duplicates->
         super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
         )._M_impl.super__Vector_impl_data._M_start;
    pppVar2 = (duplicates->
              super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    lVar5 = (long)pppVar2 - (long)__it._M_current >> 5;
    __it_00._M_current = __it._M_current;
    local_40 = local_48;
    if (0 < lVar5) {
      __it_00._M_current =
           ((long)pppVar2 - (long)__it._M_current & 0xffffffffffffffe0U) + __it._M_current;
      lVar5 = lVar5 + 1;
      do {
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::$_0>
                ::operator()((_Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                              *)&local_48,__it);
        _Var4._M_current = __it._M_current;
        p_Var6 = local_38;
        pppVar7 = local_40;
        if (bVar3) goto LAB_00f5801c;
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::$_0>
                ::operator()((_Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                              *)&local_48,
                             (__normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
                              )(__it._M_current + 1));
        _Var4._M_current = __it._M_current + 1;
        p_Var6 = local_38;
        pppVar7 = local_40;
        if (bVar3) goto LAB_00f5801c;
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::$_0>
                ::operator()((_Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                              *)&local_48,
                             (__normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
                              )(__it._M_current + 2));
        _Var4._M_current = __it._M_current + 2;
        p_Var6 = local_38;
        pppVar7 = local_40;
        if (bVar3) goto LAB_00f5801c;
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::$_0>
                ::operator()((_Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                              *)&local_48,
                             (__normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
                              )(__it._M_current + 3));
        _Var4._M_current = __it._M_current + 3;
        p_Var6 = local_38;
        pppVar7 = local_40;
        if (bVar3) goto LAB_00f5801c;
        __it._M_current = __it._M_current + 4;
        lVar5 = lVar5 + -1;
      } while (1 < lVar5);
    }
    p_Var6 = local_38;
    pppVar7 = local_40;
    lVar5 = (long)pppVar2 - (long)__it_00._M_current >> 3;
    if (lVar5 == 1) {
LAB_00f57ffb:
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::$_0>
              ::operator()((_Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                            *)&local_48,__it_00);
      _Var4._M_current = __it_00._M_current;
      if (!bVar3) {
        _Var4._M_current = pppVar2;
      }
    }
    else if (lVar5 == 2) {
LAB_00f57fe8:
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::$_0>
              ::operator()((_Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                            *)&local_48,__it_00);
      _Var4._M_current = __it_00._M_current;
      if (!bVar3) {
        __it_00._M_current = __it_00._M_current + 1;
        goto LAB_00f57ffb;
      }
    }
    else {
      _Var4._M_current = pppVar2;
      if ((lVar5 == 3) &&
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::$_0>
                  ::operator()((_Iter_pred<wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                                *)&local_48,__it_00), _Var4._M_current = __it_00._M_current, !bVar3)
         ) {
        __it_00._M_current = __it_00._M_current + 1;
        goto LAB_00f57fe8;
      }
    }
LAB_00f5801c:
    if (_Var4._M_current != pppVar7) {
      if (_Var4._M_current == pppVar2) {
        __assert_fail("first != duplicates.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binding-hash.cc"
                      ,0x56,
                      "void wabt::BindingHash::CallCallbacks(const ValueTypeVector &, DuplicateCallback) const"
                     );
      }
      if (*(long *)(p_Var6 + 1) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(p_Var6->_M_pod_data + 0x18))(p_Var6,*_Var4._M_current,*pppVar7);
    }
    local_48 = pppVar7 + 1;
  } while( true );
}

Assistant:

void BindingHash::CallCallbacks(const ValueTypeVector& duplicates,
                                DuplicateCallback callback) const {
  // Loop through all duplicates in order, and call callback with first
  // occurrence.
  for (auto iter = duplicates.begin(), end = duplicates.end(); iter != end;
       ++iter) {
    auto first = std::find_if(duplicates.begin(), duplicates.end(),
                              [iter](const value_type* x) -> bool {
                                return x->first == (*iter)->first;
                              });
    if (first == iter) {
      continue;
    }
    assert(first != duplicates.end());
    callback(**first, **iter);
  }
}